

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parity.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int fd2;
  void *buf;
  
  iVar1 = open("f0",0x242,0x1b6);
  iVar2 = open("f1",0x242,0x1b6);
  fd2 = open("f2",0x242,0x1b6);
  parityWrite(iVar1,iVar2,fd2,"hello world\n","testing 123\n",0xd);
  close(iVar1);
  close(iVar2);
  close(fd2);
  unlink("f1");
  iVar1 = open("f0",2,0x1b6);
  iVar2 = open("f2",2,0x1b6);
  buf = malloc(0xd);
  parityRead(iVar1,iVar2,buf,0xd);
  printf("f1 contents are = %s\n",buf);
  close(iVar1);
  close(iVar2);
  free(buf);
  unlink("f0");
  unlink("f2");
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    int fd0 = open("f0", O_CREAT|O_TRUNC|O_RDWR, 0666);
    int fd1 = open("f1", O_CREAT|O_TRUNC|O_RDWR, 0666);
    int fd2 = open("f2", O_CREAT|O_TRUNC|O_RDWR, 0666);

    const char* msg0 = "hello world\n";
    const char* msg1 = "testing 123\n";

    parityWrite(fd0,fd1,fd2,msg0,msg1,strlen(msg0)+1);

    close(fd0);
    close(fd1);
    close(fd2);

    unlink("f1");

    fd0 = open("f0", O_RDWR, 0666);
    fd2 = open("f2", O_RDWR, 0666);

    size_t msgSize = sizeof(char)*strlen(msg0)+1;
    char *buff = (char*)malloc(msgSize);

    parityRead(fd0, fd2, buff, msgSize);

    printf("f1 contents are = %s\n", buff);

    close(fd0);
    close(fd2);

    free(buff);

    unlink("f0");
    unlink("f2");

    return 0;
}